

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O1

pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
* __thiscall
jessilib::
split_once<std::vector<unsigned_char,std::allocator<unsigned_char>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
          (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end,uchar in_delim)

{
  pointer puVar1;
  pointer puVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  allocator_type local_69;
  pointer local_68;
  pointer puStack_60;
  pointer puStack_58;
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  pointer puStack_30;
  pointer local_28;
  pointer puStack_20;
  
  local_28 = (pointer)0x0;
  puStack_20 = (pointer)0x0;
  local_38 = (pointer)0x0;
  puStack_30 = (pointer)0x0;
  local_48 = (pointer)0x0;
  puStack_40 = (pointer)0x0;
  __last._M_current = (uchar *)this;
  if (this < begin._M_current) {
    do {
      if (*__last._M_current == (uchar)end._M_current) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_68,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )this,__last,&local_69);
        puVar1 = local_38;
        puVar2 = local_48;
        local_48 = local_68;
        puStack_40 = puStack_60;
        local_38 = puStack_58;
        local_68 = (pointer)0x0;
        puStack_60 = (pointer)0x0;
        puStack_58 = (pointer)0x0;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2,(long)puVar1 - (long)puVar2);
        }
        if (local_68 != (pointer)0x0) {
          operator_delete(local_68,(long)puStack_58 - (long)local_68);
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_68,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(__last._M_current + 1),begin,&local_69);
        puVar1 = puStack_20;
        puVar2 = puStack_30;
        puStack_30 = local_68;
        local_28 = puStack_60;
        puStack_20 = puStack_58;
        goto LAB_0032bf7f;
      }
      __last._M_current = __last._M_current + 1;
    } while (__last._M_current != begin._M_current);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_68,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )this,begin,&local_69);
    puVar1 = local_38;
    puVar2 = local_48;
    local_48 = local_68;
    puStack_40 = puStack_60;
    local_38 = puStack_58;
LAB_0032bf7f:
    local_68 = (pointer)0x0;
    puStack_60 = (pointer)0x0;
    puStack_58 = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)puVar1 - (long)puVar2);
    }
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68,(long)puStack_58 - (long)local_68);
    }
    (__return_storage_ptr__->first).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_48;
    (__return_storage_ptr__->first).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_40;
    (__return_storage_ptr__->first).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_38;
  }
  else {
    (__return_storage_ptr__->first).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->first).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->first).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  (__return_storage_ptr__->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = puStack_30;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_28;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = puStack_20;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}